

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void reportDefault(XML_Parser parser,ENCODING *enc,char *s,char *end)

{
  bool local_49;
  _func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *local_48;
  ICHAR *dataPtr;
  char **eventEndPP;
  char **eventPP;
  char *pcStack_28;
  XML_Convert_Result convert_res;
  char *end_local;
  char *s_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pcStack_28 = end;
  end_local = s;
  s_local = (char *)enc;
  enc_local = (ENCODING *)parser;
  if (enc->isUtf8 == '\0') {
    if (enc == parser->m_encoding) {
      eventEndPP = &parser->m_eventPtr;
      dataPtr = (ICHAR *)&parser->m_eventEndPtr;
    }
    else {
      eventEndPP = &parser->m_openInternalEntities->internalEventPtr;
      dataPtr = (ICHAR *)&parser->m_openInternalEntities->internalEventEndPtr;
    }
    do {
      local_48 = enc_local->isPublicId;
      eventPP._4_4_ =
           (**(code **)(s_local + 0x70))
                     (s_local,&end_local,pcStack_28,&local_48,enc_local->utf8Convert);
      *(char **)dataPtr = end_local;
      (*enc_local[1].literalScanners[1])
                ((ENCODING *)enc_local->scanners[1],(char *)enc_local->isPublicId,
                 (char *)((ulong)(local_48 + -(long)enc_local->isPublicId) & 0xffffffff),
                 (char **)(local_48 + -(long)enc_local->isPublicId));
      *eventEndPP = end_local;
      local_49 = 1 < eventPP._4_4_;
    } while (local_49);
  }
  else {
    (*parser->m_defaultHandler)(parser->m_handlerArg,s,(int)end - (int)s);
  }
  return;
}

Assistant:

static void
reportDefault(XML_Parser parser, const ENCODING *enc, const char *s,
              const char *end) {
  if (MUST_CONVERT(enc, s)) {
    enum XML_Convert_Result convert_res;
    const char **eventPP;
    const char **eventEndPP;
    if (enc == parser->m_encoding) {
      eventPP = &parser->m_eventPtr;
      eventEndPP = &parser->m_eventEndPtr;
    } else {
      /* To get here, two things must be true; the parser must be
       * using a character encoding that is not the same as the
       * encoding passed in, and the encoding passed in must need
       * conversion to the internal format (UTF-8 unless XML_UNICODE
       * is defined).  The only occasions on which the encoding passed
       * in is not the same as the parser's encoding are when it is
       * the internal encoding (e.g. a previously defined parameter
       * entity, already converted to internal format).  This by
       * definition doesn't need conversion, so the whole branch never
       * gets executed.
       *
       * For safety's sake we don't delete these lines and merely
       * exclude them from coverage statistics.
       *
       * LCOV_EXCL_START
       */
      eventPP = &(parser->m_openInternalEntities->internalEventPtr);
      eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
      /* LCOV_EXCL_STOP */
    }
    do {
      ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
      convert_res
          = XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
      *eventEndPP = s;
      parser->m_defaultHandler(parser->m_handlerArg, parser->m_dataBuf,
                               (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
      *eventPP = s;
    } while ((convert_res != XML_CONVERT_COMPLETED)
             && (convert_res != XML_CONVERT_INPUT_INCOMPLETE));
  } else
    parser->m_defaultHandler(
        parser->m_handlerArg, (const XML_Char *)s,
        (int)((const XML_Char *)end - (const XML_Char *)s));
}